

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdFreeDescriptorHandle(void *handle,void *descriptor_handle)

{
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *pvVar1;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *this;
  CfdCapiOutputDescriptor *descriptor_struct;
  string local_40;
  
  cfd::Initialize();
  if (descriptor_handle != (void *)0x0) {
    pvVar1 = *(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
              ((long)descriptor_handle + 0x10);
    if (pvVar1 != (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  0x0) {
      std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
                (pvVar1);
      operator_delete(pvVar1);
      *(undefined8 *)((long)descriptor_handle + 0x10) = 0;
    }
    pvVar1 = *(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
              ((long)descriptor_handle + 0x18);
    if (pvVar1 != (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  0x0) {
      std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
                (pvVar1);
      operator_delete(pvVar1);
      *(undefined8 *)((long)descriptor_handle + 0x18) = 0;
    }
    this = *(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> **)
            ((long)descriptor_handle + 0x20);
    if (this != (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)descriptor_handle + 0x20) = 0;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Descriptor","");
  cfd::capi::FreeBuffer(descriptor_handle,&local_40,0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdFreeDescriptorHandle(void* handle, void* descriptor_handle) {
  try {
    cfd::Initialize();
    if (descriptor_handle != nullptr) {
      CfdCapiOutputDescriptor* descriptor_struct =
          static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
      if (descriptor_struct->script_root != nullptr) {
        delete descriptor_struct->script_root;
        descriptor_struct->script_root = nullptr;
      }
      if (descriptor_struct->script_list != nullptr) {
        delete descriptor_struct->script_list;
        descriptor_struct->script_list = nullptr;
      }
      if (descriptor_struct->multisig_key_list != nullptr) {
        delete descriptor_struct->multisig_key_list;
        descriptor_struct->multisig_key_list = nullptr;
      }
    }
    FreeBuffer(
        descriptor_handle, kPrefixOutputDescriptor,
        sizeof(CfdCapiOutputDescriptor));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}